

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

FIOBJ fiobj_str_buf(size_t capa)

{
  undefined1 *puVar1;
  int *piVar2;
  size_t needed;
  fio_str_info_s fStack_28;
  
  if (capa == 0) {
    needed = sysconf(0x1e);
  }
  else {
    needed = capa + 1;
  }
  puVar1 = (undefined1 *)fio_malloc(0x40);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x28;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(undefined8 *)(puVar1 + 8) = 0;
    puVar1[0x10] = 1;
    *(undefined8 *)(puVar1 + 0x11) = 0;
    *(undefined8 *)(puVar1 + 0x19) = 0;
    *(undefined8 *)(puVar1 + 0x21) = 0;
    *(undefined8 *)(puVar1 + 0x29) = 0;
    *(undefined8 *)(puVar1 + 0x30) = 0;
    *(undefined8 *)(puVar1 + 0x38) = 0;
    if (needed != 0) {
      fio_str_capa_assert(&fStack_28,(fio_str_s_conflict *)(puVar1 + 0x10),needed);
    }
    return (ulong)puVar1 | 2;
  }
  perror("ERROR: fiobj string couldn\'t allocate memory");
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

FIOBJ fiobj_str_buf(size_t capa) {
  if (capa)
    capa = capa + 1;
  else
    capa = PAGE_SIZE;

  fiobj_str_s *s = fio_malloc(sizeof(*s));
  if (!s) {
    perror("ERROR: fiobj string couldn't allocate memory");
    exit(errno);
  }
  *s = (fiobj_str_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_STRING,
          },
      .str = FIO_STR_INIT,
  };
  if (capa) {
    fio_str_capa_assert(&s->str, capa);
  }
  return ((uintptr_t)s | FIOBJECT_STRING_FLAG);
}